

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O2

void Omega_h::any::
     vtable_dynamic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::destroy(storage_union *storage)

{
  string *this;
  
  this = (string *)storage->dynamic;
  if (this != (string *)0x0) {
    std::__cxx11::string::~string(this);
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

static void destroy(storage_union& storage) noexcept {
      // assert(reinterpret_cast<T*>(storage.dynamic));
      delete reinterpret_cast<T*>(storage.dynamic);
    }